

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::getString(Value *this,char **str,char **end)

{
  long *in_RDX;
  long *in_RSI;
  uint *in_RDI;
  uint length;
  char **in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  bool local_1;
  
  if ((in_RDI[2] & 0xff) == 4) {
    if (*(long *)in_RDI == 0) {
      local_1 = false;
    }
    else {
      decodePrefixedString
                (SUB81((ulong)in_RDX >> 0x38,0),
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI,
                 in_stack_ffffffffffffffc8);
      *in_RDX = *in_RSI + (ulong)in_stack_ffffffffffffffdc;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::getString(char const** str, char const** end) const {
  if (type_ != stringValue) return false;
  if (value_.string_ == 0) return false;
  unsigned length;
  decodePrefixedString(this->allocated_, this->value_.string_, &length, str);
  *end = *str + length;
  return true;
}